

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O3

int stopcheck3_mt(double *xi,double *xf,double fx,int N,double fo,double *jac,double *dx,double eps,
                 double stoptol,double functol,int retval)

{
  double *array;
  ulong uVar1;
  int iVar2;
  double dVar3;
  
  array = (double *)malloc((long)N << 3);
  if (retval == 3) {
    iVar2 = 4;
  }
  else if (retval == 0xf) {
    iVar2 = 0xf;
  }
  else {
    dVar3 = l2norm(jac,N);
    iVar2 = 1;
    if (stoptol <= dVar3 / (double)N) {
      iVar2 = 6;
      if (functol <=
          ABS((double)(~-(ulong)(ABS(fo) < eps) & (ulong)((fx - fo) / fo) |
                      -(ulong)(ABS(fo) < eps) & (ulong)(fx - fo)))) {
        if (0 < N) {
          uVar1 = 0;
          do {
            array[uVar1] = ABS(xf[uVar1] - xi[uVar1]) / (ABS(xf[uVar1]) + 1.0);
            uVar1 = uVar1 + 1;
          } while ((uint)N != uVar1);
        }
        dVar3 = array_max_abs(array,N);
        iVar2 = 0;
        if (dVar3 <= stoptol) {
          iVar2 = 2;
        }
      }
    }
    free(array);
  }
  return iVar2;
}

Assistant:

int stopcheck3_mt(double *xi,double *xf,double fx, int N, double fo, double *jac, double *dx, double eps,
		double stoptol, double functol, int retval) {
	int rcode,i;
	double nrm,nrmnx,relfit,num,den,stop0;
	double *scheck;
	rcode = 0;

	scheck = (double*)malloc(sizeof(double)*N);

	if (retval == 3) {
		rcode = 4;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}

	nrm = l2norm(jac, N);
	nrmnx = nrm / (double) N;

	if (fabs(fo) < eps) {
		relfit = fabs(fx - fo);
	}
	else {
		relfit = fabs((fx - fo)/fo);
	}

	if (nrmnx < stoptol) {
		rcode = 1; // Successful Convergence
	} else if (relfit < functol) {
		rcode = 6; // Relative fit less than function tolerance
	} else {
		for (i = 0; i < N; ++i) {
			den = 1.0+fabs(xf[i]);
			num = fabs(xf[i] - xi[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck, N);
		if (stop0 <= stoptol) {
			rcode = 2;
		}
	}

	free(scheck);
	return rcode;
}